

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uptime.cpp
# Opt level: O1

string * uptime_abi_cxx11_(void)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  string *in_RDI;
  uint uVar7;
  uint uVar8;
  string __str;
  double uptime;
  ifstream infile;
  long *local_2b0;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270 [2];
  long local_260 [2];
  double local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  double local_240;
  double local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,"/proc/uptime",_S_in);
  if ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 5) == 0) {
    std::istream::_M_extract<double>(local_238);
    uVar7 = (uint)(local_240 / 86400.0);
    local_248 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_248;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    if (uVar7 != 0) {
      uVar1 = -uVar7;
      if (0 < (int)uVar7) {
        uVar1 = uVar7;
      }
      uVar8 = 1;
      if (9 < uVar1) {
        uVar6 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar8 = uVar2;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            uVar8 = uVar8 - 2;
            goto LAB_00132cd7;
          }
          if (uVar4 < 1000) {
            uVar8 = uVar8 - 1;
            goto LAB_00132cd7;
          }
          if (uVar4 < 10000) goto LAB_00132cd7;
          uVar6 = uVar6 / 10000;
          uVar2 = uVar8 + 4;
        } while (99999 < uVar4);
        uVar8 = uVar8 + 1;
      }
LAB_00132cd7:
      local_250 = local_240;
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct((ulong)local_270,(char)uVar8 - (char)((int)uVar7 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_270[0]),uVar8,uVar1);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_270);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_280 = *plVar5;
        lStack_278 = plVar3[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *plVar5;
        local_290 = (long *)*plVar3;
      }
      local_288 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_290);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_2a0 = *plVar5;
        lStack_298 = plVar3[3];
        local_2b0 = &local_2a0;
      }
      else {
        local_2a0 = *plVar5;
        local_2b0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_2b0);
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      local_240 = local_250;
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
        local_240 = local_250;
      }
    }
    local_240 = local_240 - (double)(int)(uVar7 * 0x15180);
    uVar7 = (uint)(local_240 / 3600.0);
    if (uVar7 != 0) {
      uVar1 = -uVar7;
      if (0 < (int)uVar7) {
        uVar1 = uVar7;
      }
      uVar8 = 1;
      if (9 < uVar1) {
        uVar6 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar8 = uVar2;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            uVar8 = uVar8 - 2;
            goto LAB_00132eba;
          }
          if (uVar4 < 1000) {
            uVar8 = uVar8 - 1;
            goto LAB_00132eba;
          }
          if (uVar4 < 10000) goto LAB_00132eba;
          uVar6 = uVar6 / 10000;
          uVar2 = uVar8 + 4;
        } while (99999 < uVar4);
        uVar8 = uVar8 + 1;
      }
LAB_00132eba:
      local_270[0] = local_260;
      local_250 = local_240;
      std::__cxx11::string::_M_construct((ulong)local_270,(char)uVar8 - (char)((int)uVar7 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_270[0]),uVar8,uVar1);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_270);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_280 = *plVar5;
        lStack_278 = plVar3[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *plVar5;
        local_290 = (long *)*plVar3;
      }
      local_288 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_290);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_2a0 = *plVar5;
        lStack_298 = plVar3[3];
        local_2b0 = &local_2a0;
      }
      else {
        local_2a0 = *plVar5;
        local_2b0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_2b0);
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      local_240 = local_250;
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
        local_240 = local_250;
      }
    }
    local_240 = local_240 - (double)(int)(uVar7 * 0xe10);
    uVar7 = (uint)(local_240 / 60.0);
    if (uVar7 != 0) {
      uVar1 = -uVar7;
      if (0 < (int)uVar7) {
        uVar1 = uVar7;
      }
      uVar8 = 1;
      if (9 < uVar1) {
        uVar6 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar8 = uVar2;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            uVar8 = uVar8 - 2;
            goto LAB_0013309d;
          }
          if (uVar4 < 1000) {
            uVar8 = uVar8 - 1;
            goto LAB_0013309d;
          }
          if (uVar4 < 10000) goto LAB_0013309d;
          uVar6 = uVar6 / 10000;
          uVar2 = uVar8 + 4;
        } while (99999 < uVar4);
        uVar8 = uVar8 + 1;
      }
LAB_0013309d:
      local_270[0] = local_260;
      local_250 = local_240;
      std::__cxx11::string::_M_construct((ulong)local_270,(char)uVar8 - (char)((int)uVar7 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_270[0]),uVar8,uVar1);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_270);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_280 = *plVar5;
        lStack_278 = plVar3[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *plVar5;
        local_290 = (long *)*plVar3;
      }
      local_288 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_290);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_2a0 = *plVar5;
        lStack_298 = plVar3[3];
        local_2b0 = &local_2a0;
      }
      else {
        local_2a0 = *plVar5;
        local_2b0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_2b0);
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      local_240 = local_250;
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
        local_240 = local_250;
      }
    }
    uVar7 = (uint)(local_240 - (double)(int)(uVar7 * 0x3c));
    if (uVar7 != 0) {
      uVar1 = -uVar7;
      if (0 < (int)uVar7) {
        uVar1 = uVar7;
      }
      uVar8 = 1;
      if (9 < uVar1) {
        uVar6 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar8 = uVar2;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            uVar8 = uVar8 - 2;
            goto LAB_00133271;
          }
          if (uVar4 < 1000) {
            uVar8 = uVar8 - 1;
            goto LAB_00133271;
          }
          if (uVar4 < 10000) goto LAB_00133271;
          uVar6 = uVar6 / 10000;
          uVar2 = uVar8 + 4;
        } while (99999 < uVar4);
        uVar8 = uVar8 + 1;
      }
LAB_00133271:
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct((ulong)local_270,(char)uVar8 - (char)((int)uVar7 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_270[0]),uVar8,uVar1);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_270);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_280 = *plVar5;
        lStack_278 = plVar3[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *plVar5;
        local_290 = (long *)*plVar3;
      }
      local_288 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_290);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_2a0 = *plVar5;
        lStack_298 = plVar3[3];
        local_2b0 = &local_2a0;
      }
      else {
        local_2a0 = *plVar5;
        local_2b0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_2b0);
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
      }
    }
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  std::ifstream::~ifstream(local_238);
  return in_RDI;
}

Assistant:

std::string uptime() {
  std::ifstream infile("/proc/uptime");
  if (!infile) {
    return "Unknown";
  }

  double uptime;
  infile >> uptime;

  int days = static_cast<int>(uptime / 86400);
  int hours = static_cast<int>((uptime - days * 86400) / 3600);
  int mins = static_cast<int>((uptime - days * 86400 - hours * 3600) / 60);
  int secs = static_cast<int>(uptime - days * 86400 - hours * 3600 - mins * 60);

  std::string output;

  if (days) {
    output += std::to_string(days) + "day" + (days > 1 ? "s " : " ");
  }

  if (hours) {
    output += std::to_string(hours) + "hour" + (hours > 1 ? "s " : " ");
  }

  if (mins) {
    output += std::to_string(mins) + "min" + (mins > 1 ? "s " : " ");
  }

  if (secs) {
    output += std::to_string(secs) + "sec" + (secs > 1 ? "s" : "");
  }

  return output;
}